

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnReturnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  SharedValidator *this_00;
  pointer pFVar1;
  pointer pFVar2;
  Istream *this_01;
  int iVar3;
  Result RVar4;
  Index IVar5;
  Offset offset;
  uint uVar6;
  uint uVar7;
  u32 val;
  Enum EVar8;
  Index catch_drop_count;
  Location loc_1;
  Location loc;
  u32 local_10c;
  Location local_108;
  Location local_e8;
  Var local_c0;
  Var local_78;
  
  this_00 = &this->validator_;
  local_e8.field_1.field_0.last_column = 0;
  local_e8.filename._M_len = (this->filename_)._M_len;
  local_e8.filename._M_str = (this->filename_)._M_str;
  local_108.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_108.field_1.field_0.last_column = 0;
  local_108.filename._M_len = (this->filename_)._M_len;
  local_108.filename._M_str = (this->filename_)._M_str;
  local_e8.field_1.field_1.offset = local_108.field_1.field_1.offset;
  Var::Var(&local_78,func_index,&local_108);
  RVar4 = SharedValidator::OnReturnCall(this_00,&local_e8,&local_78);
  Var::~Var(&local_78);
  EVar8 = Error;
  if (RVar4.enum_ != Error) {
    pFVar1 = (this->func_types_).
             super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (uint)((ulong)((long)(this->validator_).typechecker_.type_stack_.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)(this->validator_).typechecker_.type_stack_.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
    uVar7 = (uint)((ulong)((long)*(pointer *)
                                  ((long)&pFVar1[func_index].params.
                                          super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                          ._M_impl + 8) -
                          *(long *)&pFVar1[func_index].params.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl) >> 3);
    iVar3 = uVar6 - uVar7;
    if (uVar6 < uVar7) {
      iVar3 = 0;
    }
    IVar5 = SharedValidator::GetLocalCount(this_00);
    RVar4 = TypeChecker::GetCatchCount
                      (&(this->validator_).typechecker_,
                       (int)((ulong)((long)(this->label_stack_).
                                           super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->label_stack_).
                                          super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) - 1,
                       &local_10c);
    EVar8 = Error;
    if (RVar4.enum_ != Error) {
      local_e8.field_1.field_0.last_column = 0;
      local_e8.filename._M_len = (this->filename_)._M_len;
      local_e8.filename._M_str = (this->filename_)._M_str;
      local_108.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      local_108.field_1.field_0.last_column = 0;
      local_108.filename._M_len = (this->filename_)._M_len;
      local_108.filename._M_str = (this->filename_)._M_str;
      local_e8.field_1.field_1.offset = local_108.field_1.field_1.offset;
      Var::Var(&local_c0,func_index,&local_108);
      RVar4 = SharedValidator::OnReturnCall(this_00,&local_e8,&local_c0);
      Var::~Var(&local_c0);
      if (RVar4.enum_ != Error) {
        Istream::EmitDropKeep(this->istream_,iVar3 + IVar5,uVar7);
        Istream::EmitCatchDrop(this->istream_,local_10c);
        if (func_index <
            (uint)((int)((ulong)((long)(this->func_types_).
                                       super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->func_types_).
                                      super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6) +
                  (int)((ulong)((long)(this->module_->funcs).
                                      super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->module_->funcs).
                                     super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x11111111))
        {
          Istream::Emit(this->istream_,InterpCallImport,func_index);
          Istream::Emit(this->istream_,Return);
        }
        else {
          Istream::Emit(this->istream_,InterpAdjustFrameForReturnCall,func_index);
          Istream::Emit(this->istream_,Br);
          pFVar2 = (this->module_->funcs).
                   super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = (int)((ulong)((long)(this->func_types_).
                                      super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->func_types_).
                                     super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6) +
                  (int)((ulong)((long)(this->module_->funcs).
                                      super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2) >>
                       3) * 0x11111111;
          uVar6 = func_index - uVar7;
          if (func_index < uVar7) {
            __assert_fail("func_index >= num_func_imports()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/binary-reader-interp.cc"
                          ,0x1d9,
                          "u32 wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetFuncOffset(Index)"
                         );
          }
          this_01 = this->istream_;
          val = pFVar2[uVar6].code_offset;
          if (val == 0xffffffff) {
            offset = Istream::end(this_01);
            FixupMap::Append(&this->func_fixups_,func_index,offset);
            val = pFVar2[uVar6].code_offset;
          }
          Istream::Emit(this_01,val);
        }
        EVar8 = Ok;
      }
    }
  }
  return (Result)EVar8;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallExpr(Index func_index) {
  CHECK_RESULT(
      validator_.OnReturnCall(GetLocation(), Var(func_index, GetLocation())));

  FuncType& func_type = func_types_[func_index];

  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, 0, &drop_count, &keep_count));
  CHECK_RESULT(
      validator_.GetCatchCount(label_stack_.size() - 1, &catch_drop_count));
  // The validator must be run after we get the drop/keep counts, since it
  // will change the type stack.
  CHECK_RESULT(
      validator_.OnReturnCall(GetLocation(), Var(func_index, GetLocation())));
  istream_.EmitDropKeep(drop_count, keep_count);
  istream_.EmitCatchDrop(catch_drop_count);

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::InterpAdjustFrameForReturnCall, func_index);
    istream_.Emit(Opcode::Br);
    // We emit this separately to ensure that the fixup generated by
    // GetFuncOffset comes after the Br opcode.
    istream_.Emit(GetFuncOffset(func_index));
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
    istream_.Emit(Opcode::Return);
  }

  return Result::Ok;
}